

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool Curl_ssl_getsessionid(connectdata *conn,void **ssl_sessionid,size_t *idsize,int sockindex)

{
  byte bVar1;
  Curl_easy *pCVar2;
  char *first;
  _Bool _Var3;
  int iVar4;
  ssl_primary_config *data_00;
  curl_ssl_session *pcVar5;
  int local_84;
  byte local_6d;
  int port;
  char *name;
  ssl_primary_config *ssl_config;
  _Bool isProxy;
  long *plStack_50;
  _Bool no_match;
  long *general_age;
  size_t i;
  Curl_easy *data;
  curl_ssl_session *check;
  int sockindex_local;
  size_t *idsize_local;
  void **ssl_sessionid_local;
  connectdata *conn_local;
  
  pCVar2 = conn->data;
  local_6d = 0;
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    local_6d = (conn->bits).proxy_ssl_connected[sockindex] ^ 0xff;
  }
  if ((local_6d & 1) == 0) {
    data_00 = &conn->ssl_config;
    first = (conn->host).name;
    local_84 = conn->remote_port;
  }
  else {
    data_00 = &conn->proxy_ssl_config;
    first = (conn->http_proxy).host.name;
    local_84 = (int)conn->port;
  }
  *ssl_sessionid = (void *)0x0;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    bVar1 = (pCVar2->set).proxy_ssl.primary.field_0x48;
  }
  else {
    bVar1 = (pCVar2->set).ssl.primary.field_0x48;
  }
  if ((bVar1 >> 3 & 1) != 0) {
    if ((pCVar2->share == (Curl_share *)0x0) || ((pCVar2->share->specifier & 0x10) == 0)) {
      plStack_50 = &(pCVar2->state).sessionage;
    }
    else {
      plStack_50 = &pCVar2->share->sessionage;
    }
    for (general_age = (long *)0x0; general_age < (long *)(pCVar2->set).general_ssl.max_ssl_sessions
        ; general_age = (long *)((long)general_age + 1)) {
      pcVar5 = (pCVar2->state).session + (long)general_age;
      if (((((pcVar5->sessionid != (void *)0x0) &&
            (iVar4 = Curl_strcasecompare(first,pcVar5->name), iVar4 != 0)) &&
           ((((*(uint *)&(conn->bits).field_0x4 >> 2 & 1) == 0 &&
             (pcVar5->conn_to_host == (char *)0x0)) ||
            ((((*(uint *)&(conn->bits).field_0x4 >> 2 & 1) != 0 &&
              (pcVar5->conn_to_host != (char *)0x0)) &&
             (iVar4 = Curl_strcasecompare((conn->conn_to_host).name,pcVar5->conn_to_host),
             iVar4 != 0)))))) &&
          ((((*(uint *)&(conn->bits).field_0x4 >> 3 & 1) == 0 && (pcVar5->conn_to_port == -1)) ||
           (((*(uint *)&(conn->bits).field_0x4 >> 3 & 1) != 0 &&
            ((pcVar5->conn_to_port != -1 && (conn->conn_to_port == pcVar5->conn_to_port)))))))) &&
         ((local_84 == pcVar5->remote_port &&
          ((iVar4 = Curl_strcasecompare(conn->handler->scheme,pcVar5->scheme), iVar4 != 0 &&
           (_Var3 = Curl_ssl_config_matches(data_00,&pcVar5->ssl_config), _Var3)))))) {
        *plStack_50 = *plStack_50 + 1;
        pcVar5->age = *plStack_50;
        *ssl_sessionid = pcVar5->sessionid;
        if (idsize != (size_t *)0x0) {
          *idsize = pcVar5->idsize;
        }
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool Curl_ssl_getsessionid(struct connectdata *conn,
                           void **ssl_sessionid,
                           size_t *idsize, /* set 0 if unknown */
                           int sockindex)
{
  struct curl_ssl_session *check;
  struct Curl_easy *data = conn->data;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

  const bool isProxy = CONNECT_PROXY_SSL();
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;
  const char * const name = isProxy ? conn->http_proxy.host.name :
    conn->host.name;
  int port = isProxy ? (int)conn->port : conn->remote_port;
  *ssl_sessionid = NULL;

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  if(!SSL_SET_OPTION(primary.sessionid))
    /* session ID re-use is disabled */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(name, check->name) &&
       ((!conn->bits.conn_to_host && !check->conn_to_host) ||
        (conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(conn->conn_to_host.name, check->conn_to_host))) &&
       ((!conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (conn->bits.conn_to_port && check->conn_to_port != -1 &&
         conn->conn_to_port == check->conn_to_port)) &&
       (port == check->remote_port) &&
       strcasecompare(conn->handler->scheme, check->scheme) &&
       Curl_ssl_config_matches(ssl_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  return no_match;
}